

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.c
# Opt level: O0

Vec_Ptr_t * populateLivenessVector(Abc_Ntk_t *pNtk,Aig_Man_t *pAig)

{
  int iVar1;
  Vec_Ptr_t *p;
  Abc_Obj_t *pObj;
  char *pcVar2;
  Aig_Obj_t *Entry;
  Vec_Ptr_t *vLive;
  int liveCounter;
  int i;
  Abc_Obj_t *pNode;
  Aig_Man_t *pAig_local;
  Abc_Ntk_t *pNtk_local;
  
  vLive._0_4_ = 0;
  p = Vec_PtrAlloc(100);
  for (vLive._4_4_ = 0; iVar1 = Abc_NtkPoNum(pNtk), vLive._4_4_ < iVar1;
      vLive._4_4_ = vLive._4_4_ + 1) {
    pObj = Abc_NtkPo(pNtk,vLive._4_4_);
    pcVar2 = Abc_ObjName(pObj);
    pcVar2 = strstr(pcVar2,"assert_fair");
    if (pcVar2 != (char *)0x0) {
      Entry = Aig_ManCo(pAig,vLive._4_4_);
      Vec_PtrPush(p,Entry);
      vLive._0_4_ = (uint)vLive + 1;
    }
  }
  printf("\nNumber of liveness property found = %d\n",(ulong)(uint)vLive);
  return p;
}

Assistant:

Vec_Ptr_t * populateLivenessVector( Abc_Ntk_t *pNtk, Aig_Man_t *pAig )
{
    Abc_Obj_t * pNode;
    int i, liveCounter = 0;
    Vec_Ptr_t * vLive;

    vLive = Vec_PtrAlloc( 100 );
    Abc_NtkForEachPo( pNtk, pNode, i )
        //if( strstr( Abc_ObjName( pNode ), "assert_fair") != NULL )
        if( nodeName_starts_with( pNode, "assert_fair" ) )
        {
            Vec_PtrPush( vLive, Aig_ManCo( pAig, i ) );
            liveCounter++;
        }
    printf("Number of liveness property found = %d\n", liveCounter);
    return vLive;
}